

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QTreeViewItem>::copyAppend
          (QGenericArrayOps<QTreeViewItem> *this,QTreeViewItem *b,QTreeViewItem *e)

{
  QTreeViewItem *pQVar1;
  void *in_RDX;
  void *in_RSI;
  long in_RDI;
  QTreeViewItem *data;
  void *local_10;
  
  if (in_RSI != in_RDX) {
    pQVar1 = QArrayDataPointer<QTreeViewItem>::begin((QArrayDataPointer<QTreeViewItem> *)0x909ac7);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      memcpy(pQVar1 + *(long *)(in_RDI + 0x10),local_10,0x28);
      local_10 = (void *)((long)local_10 + 0x28);
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }